

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O2

int gray_raster_render(gray_PRaster raster,SW_FT_Raster_Params *params)

{
  short *psVar1;
  long lVar2;
  long *plVar3;
  TPos TVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  SW_FT_Vector *pSVar13;
  SW_FT_Vector *pSVar14;
  TPos *pTVar15;
  long lVar16;
  gray_TBand *band;
  int num_bands;
  int n;
  TPos max;
  TPos min;
  gray_TWorker_ local_5338;
  gray_TBand bands [40];
  TCell buffer [512];
  
  psVar1 = (short *)params->source;
  iVar10 = -1;
  iVar11 = iVar10;
  if (psVar1 != (short *)0x0) {
    iVar11 = 0;
    if ((((psVar1[1] != 0) && (0 < (long)*psVar1)) &&
        (iVar11 = iVar10, *(long *)(psVar1 + 0xc) != 0)) &&
       ((*(long *)(psVar1 + 4) != 0 &&
        (*(short *)(*(long *)(psVar1 + 0xc) + -2 + (long)*psVar1 * 2) + 1 == (int)psVar1[1])))) {
      if ((params->flags & 1U) == 0) {
        iVar11 = -2;
      }
      else {
        if ((params->flags & 4U) == 0) {
          local_5338.clip_box.xMin = -0x8000;
          local_5338.clip_box.yMin = -0x8000;
          local_5338.clip_box.xMax = 0x7fff;
          local_5338.clip_box.yMax = 0x7fff;
        }
        else {
          local_5338.clip_box.xMin = (params->clip_box).xMin;
          local_5338.clip_box.yMin = (params->clip_box).yMin;
          local_5338.clip_box.xMax = (params->clip_box).xMax;
          local_5338.clip_box.yMax = (params->clip_box).yMax;
        }
        local_5338.buffer = buffer;
        local_5338.buffer_size = 0x4000;
        local_5338.area = 0;
        local_5338.cover = 0;
        local_5338.num_cells = 0;
        local_5338.cells = (PCell_conflict)0x0;
        local_5338.max_cells = 0;
        iVar11 = 1;
        local_5338.bound_left = 0x7fffffff;
        local_5338.bound_top = 0x7fffffff;
        local_5338.bound_right = -0x80000000;
        local_5338.bound_bottom = -0x80000000;
        local_5338.outline.n_contours = psVar1[0];
        local_5338.outline.n_points = psVar1[1];
        local_5338.outline._4_2_ = psVar1[2];
        local_5338.outline._6_2_ = psVar1[3];
        local_5338.outline.points = *(SW_FT_Vector **)(psVar1 + 4);
        local_5338.outline.tags = *(char **)(psVar1 + 8);
        local_5338.outline.contours = *(short **)(psVar1 + 0xc);
        local_5338.outline.contours_flag = *(char **)(psVar1 + 0x10);
        local_5338.outline._40_8_ = *(undefined8 *)(psVar1 + 0x14);
        local_5338.invalid = 1;
        local_5338.band_size = 0x40;
        local_5338.num_gray_spans = 0;
        local_5338.render_span = params->gray_spans;
        local_5338.render_span_data = params->user;
        if ((long)local_5338.outline.n_points < 1) {
          local_5338.min_ey = 0;
          local_5338.max_ey = 0;
          local_5338.min_ex = 0;
          local_5338.max_ex = 0;
        }
        else {
          lVar7 = (local_5338.outline.points)->x;
          lVar9 = (local_5338.outline.points)->y;
          local_5338.min_ex = lVar7;
          pSVar14 = local_5338.outline.points;
          lVar16 = lVar9;
          while (pSVar13 = pSVar14 + 1,
                pSVar13 < local_5338.outline.points + local_5338.outline.n_points) {
            lVar12 = pSVar13->x;
            lVar2 = pSVar14[1].y;
            if (lVar12 < local_5338.min_ex) {
              local_5338.min_ex = lVar12;
            }
            if (lVar7 < lVar12) {
              lVar7 = lVar12;
            }
            if (lVar2 < lVar9) {
              lVar9 = lVar2;
            }
            pSVar14 = pSVar13;
            if (lVar16 < lVar2) {
              lVar16 = lVar2;
            }
          }
          local_5338.min_ex = local_5338.min_ex >> 6;
          local_5338.min_ey = lVar9 >> 6;
          local_5338.max_ex = lVar7 + 0x3f >> 6;
          local_5338.max_ey = lVar16 + 0x3f >> 6;
        }
        iVar10 = iVar11;
        local_5338.ycells = (PCell_conflict *)local_5338.buffer;
        if (((local_5338.clip_box.xMin < local_5338.max_ex) &&
            (iVar10 = local_5338.invalid, local_5338.min_ex < local_5338.clip_box.xMax)) &&
           ((local_5338.clip_box.yMin < local_5338.max_ey &&
            (local_5338.min_ey < local_5338.clip_box.yMax)))) {
          if (local_5338.min_ex < local_5338.clip_box.xMin) {
            local_5338.min_ex = local_5338.clip_box.xMin;
          }
          if (local_5338.min_ey < local_5338.clip_box.yMin) {
            local_5338.min_ey = local_5338.clip_box.yMin;
          }
          if (local_5338.clip_box.xMax < local_5338.max_ex) {
            local_5338.max_ex = local_5338.clip_box.xMax;
          }
          if (local_5338.clip_box.yMax < local_5338.max_ey) {
            local_5338.max_ey = local_5338.clip_box.yMax;
          }
          TVar4 = local_5338.max_ey;
          local_5338.count_ex = local_5338.max_ex - local_5338.min_ex;
          local_5338.count_ey = local_5338.max_ey - local_5338.min_ey;
          num_bands = (int)(local_5338.count_ey / 0x40);
          if (num_bands == 0) {
            num_bands = 1;
          }
          if (0x26 < num_bands) {
            num_bands = 0x27;
          }
          local_5338.band_shoot = 0;
          min = local_5338.min_ey;
          local_5338.invalid = iVar11;
          for (n = 0; band = bands, n < num_bands; n = n + 1) {
            if ((n == num_bands + -1) ||
               (max = local_5338.band_size + min, TVar4 < local_5338.band_size + min)) {
              max = TVar4;
            }
            bands[0].min = min;
            bands[0].max = max;
            while (bands <= band) {
              local_5338.ycells = (PCell_conflict *)local_5338.buffer;
              local_5338.ycount = band->max - band->min;
              uVar6 = (local_5338.ycount * 8 & 0xffffffffffffffe0U) + 0x20;
              if ((local_5338.ycount & 3U) == 0) {
                uVar6 = local_5338.ycount * 8;
              }
              local_5338.cells = (PCell_conflict)((long)(TPos *)local_5338.buffer + uVar6);
              lVar7 = (local_5338.buffer_size & 0xffffffffffffffe0U) - uVar6;
              if ((lVar7 == 0 || (long)(local_5338.buffer_size & 0xffffffffffffffe0U) < (long)uVar6)
                 || (local_5338.max_cells = lVar7 >> 5, local_5338.max_cells < 2)) {
LAB_001079d1:
                lVar7 = band->min;
                lVar9 = band->max;
                iVar10 = local_5338.invalid;
                if ((ulong)(lVar9 - lVar7) < 2) goto LAB_00107ab5;
                if ((long)local_5338.band_size <= lVar7 - lVar9) {
                  local_5338.band_shoot = local_5338.band_shoot + 1;
                }
                lVar16 = (lVar9 - lVar7 >> 1) + lVar7;
                band[1].min = lVar7;
                band[1].max = lVar16;
                band->min = lVar16;
                band->max = lVar9;
                band = band + 1;
              }
              else {
                uVar6 = local_5338.ycount;
                if (local_5338.ycount < 1) {
                  uVar6 = 0;
                }
                for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
                  ((TPos *)local_5338.buffer)[uVar8] = 0;
                }
                local_5338.num_cells = 0;
                local_5338.invalid = 1;
                local_5338.min_ey = band->min;
                local_5338.max_ey = band->max;
                local_5338.count_ey = band->max - band->min;
                iVar5 = gray_convert_glyph_inner(&local_5338);
                if (iVar5 == -4) goto LAB_001079d1;
                iVar10 = local_5338.invalid;
                if (iVar5 != 0) goto LAB_00107ab5;
                if (local_5338.num_cells != 0) {
                  local_5338.num_gray_spans = 0;
                  for (lVar7 = 0; lVar7 < local_5338.ycount; lVar7 = lVar7 + 1) {
                    lVar16 = 0;
                    lVar9 = 0;
                    pTVar15 = (TPos *)local_5338.ycells + lVar7;
                    while (plVar3 = (long *)*pTVar15, plVar3 != (long *)0x0) {
                      lVar12 = *plVar3;
                      if ((lVar16 != 0) && (lVar12 - lVar9 != 0 && lVar9 <= lVar12)) {
                        gray_hline(&local_5338,lVar9,lVar7,lVar16 << 9,lVar12 - lVar9);
                        lVar12 = *plVar3;
                      }
                      lVar16 = lVar16 + plVar3[1];
                      lVar9 = lVar16 * 0x200 - (long)(int)plVar3[2];
                      if (-1 < lVar12 && lVar9 != 0) {
                        gray_hline(&local_5338,lVar12,lVar7,lVar9,1);
                        lVar12 = *plVar3;
                      }
                      lVar9 = lVar12 + 1;
                      pTVar15 = plVar3 + 3;
                    }
                    if (lVar16 != 0) {
                      gray_hline(&local_5338,lVar9,lVar7,lVar16 << 9,local_5338.count_ex - lVar9);
                    }
                  }
                  if ((local_5338.render_span != (SW_FT_SpanFunc)0x0) &&
                     (0 < local_5338.num_gray_spans)) {
                    (*local_5338.render_span)
                              (local_5338.num_gray_spans,local_5338.gray_spans,
                               local_5338.render_span_data);
                  }
                }
                band = band + -1;
              }
            }
            min = max;
          }
          iVar10 = local_5338.invalid;
          if ((8 < local_5338.band_shoot) && (0x10 < local_5338.band_size)) {
            local_5338.band_size = (uint)local_5338.band_size >> 1;
          }
        }
LAB_00107ab5:
        local_5338.invalid = iVar10;
        (*params->bbox_cb)(local_5338.bound_left,local_5338.bound_top,
                           local_5338.bound_right - local_5338.bound_left,
                           (local_5338.bound_bottom - local_5338.bound_top) + 1,params->user);
      }
    }
  }
  return iVar11;
}

Assistant:

static int gray_raster_render(gray_PRaster               raster,
                              const SW_FT_Raster_Params* params)
{
    SW_FT_UNUSED(raster);
    const SW_FT_Outline* outline = (const SW_FT_Outline*)params->source;

    gray_TWorker worker[1];

    TCell buffer[SW_FT_RENDER_POOL_SIZE / sizeof(TCell)];
    long  buffer_size = sizeof(buffer);
    int   band_size = (int)(buffer_size / (long)(sizeof(TCell) * 8));

    if (!outline) return SW_FT_THROW(Invalid_Outline);

    /* return immediately if the outline is empty */
    if (outline->n_points == 0 || outline->n_contours <= 0) return 0;

    if (!outline->contours || !outline->points)
        return SW_FT_THROW(Invalid_Outline);

    if (outline->n_points != outline->contours[outline->n_contours - 1] + 1)
        return SW_FT_THROW(Invalid_Outline);

    /* this version does not support monochrome rendering */
    if (!(params->flags & SW_FT_RASTER_FLAG_AA))
        return SW_FT_THROW(Invalid_Mode);

    if (params->flags & SW_FT_RASTER_FLAG_CLIP)
        ras.clip_box = params->clip_box;
    else {
        ras.clip_box.xMin = -32768L;
        ras.clip_box.yMin = -32768L;
        ras.clip_box.xMax = 32767L;
        ras.clip_box.yMax = 32767L;
    }

    gray_init_cells(RAS_VAR_ buffer, buffer_size);

    ras.outline = *outline;
    ras.num_cells = 0;
    ras.invalid = 1;
    ras.band_size = band_size;
    ras.num_gray_spans = 0;

    ras.render_span = (SW_FT_Raster_Span_Func)params->gray_spans;
    ras.render_span_data = params->user;

    gray_convert_glyph(RAS_VAR);
    params->bbox_cb(ras.bound_left, ras.bound_top,
                    ras.bound_right - ras.bound_left,
                    ras.bound_bottom - ras.bound_top + 1, params->user);
    return 1;
}